

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O1

void __thiscall
ParserTest_UnaryLogical_Test::~ParserTest_UnaryLogical_Test(ParserTest_UnaryLogical_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, UnaryLogical)
{
  std::unique_ptr<ExpressionNode> node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2),
      BinaryOperator::Greater,
      std::make_unique<NumericLiteralNode>(3));
  setupTest("(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(    
        std::make_unique<NumericLiteralNode>(1),
        BinaryOperator::Less,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!1 < 3", &Parser::parseUnaryLogical, std::move(node));
}